

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DataStructures.pb.cc
# Opt level: O2

size_t __thiscall CoreML::Specification::DoubleRange::ByteSizeLong(DoubleRange *this)

{
  size_t sVar1;
  size_t sVar2;
  ulong uVar3;
  
  uVar3 = (ulong)(-(uint)(this->minvalue_ != 0.0) & 1);
  sVar1 = uVar3 * 9 + 9;
  sVar2 = uVar3 * 9;
  if (this->maxvalue_ != 0.0) {
    sVar2 = sVar1;
  }
  if (NAN(this->maxvalue_)) {
    sVar2 = sVar1;
  }
  this->_cached_size_ = (int)sVar2;
  return sVar2;
}

Assistant:

size_t DoubleRange::ByteSizeLong() const {
// @@protoc_insertion_point(message_byte_size_start:CoreML.Specification.DoubleRange)
  size_t total_size = 0;

  // double minValue = 1;
  if (this->minvalue() != 0) {
    total_size += 1 + 8;
  }

  // double maxValue = 2;
  if (this->maxvalue() != 0) {
    total_size += 1 + 8;
  }

  int cached_size = ::google::protobuf::internal::ToCachedSize(total_size);
  GOOGLE_SAFE_CONCURRENT_WRITES_BEGIN();
  _cached_size_ = cached_size;
  GOOGLE_SAFE_CONCURRENT_WRITES_END();
  return total_size;
}